

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::convert_row_major_matrix
          (string *__return_storage_ptr__,CompilerGLSL *this,string *exp_str,SPIRType *exp_type,
          uint32_t param_3,bool param_4)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long *plVar7;
  uint uVar8;
  size_type *psVar9;
  undefined4 in_register_00000084;
  char (*ts_2) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  undefined1 local_7e;
  undefined1 local_7d [21];
  char local_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  ts_2 = (char (*) [2])CONCAT44(in_register_00000084,param_3);
  strip_enclosed_expression((CompilerGLSL *)__return_storage_ptr__,exp_str);
  bVar4 = Compiler::is_matrix(&this->super_Compiler,exp_type);
  if (bVar4) {
    join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x2e9719,(char (*) [11])exp_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2dfe76,ts_2);
  }
  else {
    lVar6 = ::std::__cxx11::string::rfind((char)exp_str,0x5b);
    if (lVar6 == -1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (exp_str->_M_dataplus)._M_p;
      paVar1 = &exp_str->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar1) {
        uVar3 = *(undefined8 *)((long)&exp_str->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = exp_str->_M_string_length;
      (exp_str->_M_dataplus)._M_p = (pointer)paVar1;
      exp_str->_M_string_length = 0;
      (exp_str->field_2)._M_local_buf[0] = '\0';
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_50,(ulong)exp_str);
      ::std::__cxx11::string::resize((ulong)exp_str,(char)lVar6);
      type_to_glsl_constructor_abi_cxx11_((string *)(local_7d + 5),this,exp_type);
      plVar7 = (long *)::std::__cxx11::string::append(local_7d + 5);
      local_58 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar9) {
        lVar6 = plVar7[3];
        local_58->_M_allocated_capacity = *psVar9;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      }
      __return_storage_ptr__->_M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((char *)local_7d._5_8_ != local_68) {
        operator_delete((void *)local_7d._5_8_);
      }
      local_7d._1_4_ = 0;
      if (exp_type->vecsize != 0) {
        do {
          local_7d[0] = 0x5b;
          local_7e = 0x5d;
          join<std::__cxx11::string&,char,unsigned_int&,char,std::__cxx11::string&>
                    ((string *)(local_7d + 5),(spirv_cross *)exp_str,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d,
                     local_7d + 1,(uint *)&local_7e,(char *)local_50,in_stack_ffffffffffffff78);
          ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_7d._5_8_);
          if ((char *)local_7d._5_8_ != local_68) {
            operator_delete((void *)local_7d._5_8_);
          }
          uVar5 = local_7d._1_4_ + 1;
          uVar8 = exp_type->vecsize;
          if (uVar5 < uVar8) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar8 = exp_type->vecsize;
            uVar5 = local_7d._1_4_ + 1;
          }
          local_7d._1_4_ = uVar5;
        } while (uVar5 < uVar8);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t /* physical_type_id */,
                                              bool /*is_packed*/)
{
	strip_enclosed_expression(exp_str);
	if (!is_matrix(exp_type))
	{
		auto column_index = exp_str.find_last_of('[');
		if (column_index == string::npos)
			return exp_str;

		auto column_expr = exp_str.substr(column_index);
		exp_str.resize(column_index);

		auto transposed_expr = type_to_glsl_constructor(exp_type) + "(";

		// Loading a column from a row-major matrix. Unroll the load.
		for (uint32_t c = 0; c < exp_type.vecsize; c++)
		{
			transposed_expr += join(exp_str, '[', c, ']', column_expr);
			if (c + 1 < exp_type.vecsize)
				transposed_expr += ", ";
		}

		transposed_expr += ")";
		return transposed_expr;
	}
	else
		return join("transpose(", exp_str, ")");
}